

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O1

void xxHash64_test(void *key,int len,uint32_t seed,void *out)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  lVar6 = (long)len;
  uVar9 = (ulong)seed;
  if ((uint)len < 0x20) {
    uVar9 = uVar9 + 0x27d4eb2f165667c5 + lVar6;
    switch(len & 0x1f) {
    case 0:
      goto switchD_00109600_caseD_0;
    case 2:
      goto switchD_00109600_caseD_2;
    case 3:
      goto switchD_00109600_caseD_3;
    case 4:
      goto switchD_00109600_caseD_4;
    case 5:
      goto switchD_00109600_caseD_5;
    case 6:
      goto switchD_00109600_caseD_6;
    case 7:
      goto switchD_00109600_caseD_7;
    case 8:
      goto switchD_00109600_caseD_8;
    case 9:
      goto switchD_00109600_caseD_9;
    case 10:
      goto switchD_00109600_caseD_a;
    case 0xb:
      goto switchD_00109600_caseD_b;
    case 0xc:
      goto switchD_00109600_caseD_c;
    case 0xd:
      goto switchD_00109600_caseD_d;
    case 0xe:
      goto switchD_00109600_caseD_e;
    case 0xf:
      goto switchD_00109600_caseD_f;
    case 0x10:
      goto switchD_00109600_caseD_10;
    case 0x11:
      goto switchD_00109600_caseD_11;
    case 0x12:
      goto switchD_00109600_caseD_12;
    case 0x13:
      goto switchD_00109600_caseD_13;
    case 0x14:
      goto switchD_00109600_caseD_14;
    case 0x15:
      goto switchD_00109600_caseD_15;
    case 0x16:
      goto switchD_00109600_caseD_16;
    case 0x17:
      goto switchD_00109600_caseD_17;
    case 0x18:
      goto switchD_00109600_caseD_18;
    case 0x19:
      goto switchD_00109600_caseD_19;
    case 0x1a:
      goto switchD_00109600_caseD_1a;
    case 0x1b:
      goto switchD_00109600_caseD_1b;
    case 0x1c:
      goto switchD_00109600_caseD_1c;
    case 0x1d:
      goto switchD_00109600_caseD_1d;
    case 0x1e:
      goto switchD_00109600_caseD_1e;
    case 0x1f:
      goto switchD_00109600_caseD_1f;
    }
  }
  else {
    puVar1 = (uint *)((long)key + lVar6 + -0x20);
    uVar7 = uVar9 + 0x60ea27eeadc0b5d6;
    uVar4 = uVar9 + 0xc2b2ae3d27d4eb4f;
    uVar11 = uVar9 + 0x61c8864e7a143579;
    do {
      uVar7 = *key * -0x3d4d51c2d82b14b1 + uVar7;
      uVar3 = uVar7 >> 0x21 | uVar7 * 0x80000000;
      uVar7 = uVar3 * -0x61c8864e7a143579;
      uVar4 = *(long *)((long)key + 8) * -0x3d4d51c2d82b14b1 + uVar4;
      uVar5 = uVar4 >> 0x21 | uVar4 * 0x80000000;
      uVar4 = uVar5 * -0x61c8864e7a143579;
      uVar9 = *(long *)((long)key + 0x10) * -0x3d4d51c2d82b14b1 + uVar9;
      uVar8 = uVar9 >> 0x21 | uVar9 * 0x80000000;
      uVar9 = uVar8 * -0x61c8864e7a143579;
      uVar11 = *(long *)((long)key + 0x18) * -0x3d4d51c2d82b14b1 + uVar11;
      uVar10 = uVar11 >> 0x21 | uVar11 * 0x80000000;
      uVar11 = uVar10 * -0x61c8864e7a143579;
      key = (void *)((long)key + 0x20);
    } while (key <= puVar1);
    uVar9 = ((uVar10 * -0x210ca4fef0869357 >> 0x21 | uVar10 * -0x784349ab80000000) *
             -0x61c8864e7a143579 ^
            ((uVar8 * -0x210ca4fef0869357 >> 0x21 | uVar8 * -0x784349ab80000000) *
             -0x61c8864e7a143579 ^
            ((uVar5 * -0x210ca4fef0869357 >> 0x21 | uVar5 * -0x784349ab80000000) *
             -0x61c8864e7a143579 ^
            ((uVar3 * -0x210ca4fef0869357 >> 0x21 | uVar3 * -0x784349ab80000000) *
             -0x61c8864e7a143579 ^
            (uVar11 >> 0x2e | uVar10 * -0x1939e850d5e40000) +
            (uVar9 >> 0x34 | uVar8 * 0x779b185ebca87000) +
            (uVar4 >> 0x39 | uVar5 * 0x1bbcd8c2f5e54380) +
            (uVar7 >> 0x3f | uVar3 * 0x3c6ef3630bd7950e)) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63
            ) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63
            ) * -0x61c8864e7a143579 + -0x7a1435883d4d519d + lVar6;
    switch(len & 0x1f) {
    case 0:
      goto switchD_00109600_caseD_0;
    case 1:
      break;
    case 3:
switchD_00109600_caseD_3:
      uVar2 = *key;
      key = (void *)((long)key + 1);
      uVar9 = (ulong)(byte)uVar2 * 0x27d4eb2f165667c5 ^ uVar9;
      uVar9 = (uVar9 >> 0x35 | uVar9 << 0xb) * -0x61c8864e7a143579;
    case 2:
switchD_00109600_caseD_2:
      uVar2 = *key;
      key = (void *)((long)key + 1);
      uVar9 = (ulong)(byte)uVar2 * 0x27d4eb2f165667c5 ^ uVar9;
      uVar9 = (uVar9 >> 0x35 | uVar9 << 0xb) * -0x61c8864e7a143579;
      break;
    case 4:
      goto switchD_00109600_caseD_4;
    case 5:
      goto switchD_00109600_caseD_5;
    case 6:
      goto switchD_00109600_caseD_6;
    case 7:
      goto switchD_00109600_caseD_7;
    case 8:
      goto switchD_00109600_caseD_8;
    case 9:
      goto switchD_00109600_caseD_9;
    case 10:
      goto switchD_00109600_caseD_a;
    case 0xb:
      goto switchD_00109600_caseD_b;
    case 0xc:
      goto switchD_00109600_caseD_c;
    case 0xd:
      goto switchD_00109600_caseD_d;
    case 0xe:
      goto switchD_00109600_caseD_e;
    case 0xf:
      goto switchD_00109600_caseD_f;
    case 0x18:
switchD_00109600_caseD_18:
      uVar9 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
              -0x61c8864e7a143579 ^ uVar9;
      key = (void *)((long)key + 8);
      uVar9 = (uVar9 >> 0x25 | uVar9 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    case 0x10:
switchD_00109600_caseD_10:
      uVar9 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
              -0x61c8864e7a143579 ^ uVar9;
      key = (void *)((long)key + 8);
      uVar9 = (uVar9 >> 0x25 | uVar9 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
      goto switchD_00109600_caseD_8;
    case 0x19:
switchD_00109600_caseD_19:
      uVar9 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
              -0x61c8864e7a143579 ^ uVar9;
      key = (void *)((long)key + 8);
      uVar9 = (uVar9 >> 0x25 | uVar9 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    case 0x11:
switchD_00109600_caseD_11:
      uVar9 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
              -0x61c8864e7a143579 ^ uVar9;
      key = (void *)((long)key + 8);
      uVar9 = (uVar9 >> 0x25 | uVar9 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
      goto switchD_00109600_caseD_9;
    case 0x1a:
switchD_00109600_caseD_1a:
      uVar9 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
              -0x61c8864e7a143579 ^ uVar9;
      key = (void *)((long)key + 8);
      uVar9 = (uVar9 >> 0x25 | uVar9 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    case 0x12:
switchD_00109600_caseD_12:
      uVar9 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
              -0x61c8864e7a143579 ^ uVar9;
      key = (void *)((long)key + 8);
      uVar9 = (uVar9 >> 0x25 | uVar9 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
      goto switchD_00109600_caseD_a;
    case 0x1b:
switchD_00109600_caseD_1b:
      uVar9 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
              -0x61c8864e7a143579 ^ uVar9;
      key = (void *)((long)key + 8);
      uVar9 = (uVar9 >> 0x25 | uVar9 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    case 0x13:
switchD_00109600_caseD_13:
      uVar9 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
              -0x61c8864e7a143579 ^ uVar9;
      key = (void *)((long)key + 8);
      uVar9 = (uVar9 >> 0x25 | uVar9 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
      goto switchD_00109600_caseD_b;
    case 0x1c:
switchD_00109600_caseD_1c:
      uVar9 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
              -0x61c8864e7a143579 ^ uVar9;
      key = (void *)((long)key + 8);
      uVar9 = (uVar9 >> 0x25 | uVar9 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    case 0x14:
switchD_00109600_caseD_14:
      uVar9 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
              -0x61c8864e7a143579 ^ uVar9;
      key = (void *)((long)key + 8);
      uVar9 = (uVar9 >> 0x25 | uVar9 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
      goto switchD_00109600_caseD_c;
    case 0x1d:
switchD_00109600_caseD_1d:
      uVar9 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
              -0x61c8864e7a143579 ^ uVar9;
      key = (void *)((long)key + 8);
      uVar9 = (uVar9 >> 0x25 | uVar9 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    case 0x15:
switchD_00109600_caseD_15:
      uVar9 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
              -0x61c8864e7a143579 ^ uVar9;
      key = (void *)((long)key + 8);
      uVar9 = (uVar9 >> 0x25 | uVar9 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
      goto switchD_00109600_caseD_d;
    case 0x1e:
switchD_00109600_caseD_1e:
      uVar9 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
              -0x61c8864e7a143579 ^ uVar9;
      key = (void *)((long)key + 8);
      uVar9 = (uVar9 >> 0x25 | uVar9 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    case 0x16:
switchD_00109600_caseD_16:
      uVar9 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
              -0x61c8864e7a143579 ^ uVar9;
      key = (void *)((long)key + 8);
      uVar9 = (uVar9 >> 0x25 | uVar9 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
      goto switchD_00109600_caseD_e;
    case 0x1f:
switchD_00109600_caseD_1f:
      uVar9 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
              -0x61c8864e7a143579 ^ uVar9;
      key = (void *)((long)key + 8);
      uVar9 = (uVar9 >> 0x25 | uVar9 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    case 0x17:
switchD_00109600_caseD_17:
      uVar9 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
              -0x61c8864e7a143579 ^ uVar9;
      key = (void *)((long)key + 8);
      uVar9 = (uVar9 >> 0x25 | uVar9 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
      goto switchD_00109600_caseD_f;
    }
  }
  uVar9 = (ulong)(byte)*key * 0x27d4eb2f165667c5 ^ uVar9;
  uVar9 = uVar9 >> 0x35 | uVar9 << 0xb;
  goto LAB_00109ab8;
switchD_00109600_caseD_f:
  uVar9 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
          -0x61c8864e7a143579 ^ uVar9;
  key = (void *)((long)key + 8);
  uVar9 = (uVar9 >> 0x25 | uVar9 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  goto switchD_00109600_caseD_7;
switchD_00109600_caseD_e:
  uVar9 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
          -0x61c8864e7a143579 ^ uVar9;
  key = (void *)((long)key + 8);
  uVar9 = (uVar9 >> 0x25 | uVar9 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  goto switchD_00109600_caseD_6;
switchD_00109600_caseD_d:
  uVar9 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
          -0x61c8864e7a143579 ^ uVar9;
  key = (void *)((long)key + 8);
  uVar9 = (uVar9 >> 0x25 | uVar9 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  goto switchD_00109600_caseD_5;
switchD_00109600_caseD_c:
  uVar9 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
          -0x61c8864e7a143579 ^ uVar9;
  key = (void *)((long)key + 8);
  uVar9 = (uVar9 >> 0x25 | uVar9 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  goto switchD_00109600_caseD_4;
switchD_00109600_caseD_b:
  uVar9 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
          -0x61c8864e7a143579 ^ uVar9;
  uVar9 = (ulong)(byte)*(uint *)((long)key + 8) * 0x27d4eb2f165667c5 ^
          (uVar9 >> 0x25 | uVar9 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  uVar9 = (ulong)*(byte *)((long)key + 9) * 0x27d4eb2f165667c5 ^
          (uVar9 >> 0x35 | uVar9 << 0xb) * -0x61c8864e7a143579;
  uVar9 = (uVar9 >> 0x35 | uVar9 << 0xb) * -0x61c8864e7a143579;
  uVar4 = (ulong)*(byte *)((long)key + 10);
  goto LAB_00109aab;
switchD_00109600_caseD_a:
  uVar9 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
          -0x61c8864e7a143579 ^ uVar9;
  uVar9 = (ulong)(byte)*(uint *)((long)key + 8) * 0x27d4eb2f165667c5 ^
          (uVar9 >> 0x25 | uVar9 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  uVar9 = (uVar9 >> 0x35 | uVar9 << 0xb) * -0x61c8864e7a143579;
  uVar4 = (ulong)*(byte *)((long)key + 9);
  goto LAB_00109aab;
switchD_00109600_caseD_9:
  uVar9 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
          -0x61c8864e7a143579 ^ uVar9;
  uVar9 = (uVar9 >> 0x25 | uVar9 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  uVar4 = (ulong)(byte)*(uint *)((long)key + 8);
LAB_00109aab:
  uVar9 = uVar4 * 0x27d4eb2f165667c5 ^ uVar9;
  uVar9 = uVar9 >> 0x35 | uVar9 << 0xb;
LAB_00109ab8:
  uVar9 = uVar9 * -0x61c8864e7a143579;
  goto switchD_00109600_caseD_0;
switchD_00109600_caseD_7:
  uVar9 = (ulong)*key * -0x61c8864e7a143579 ^ uVar9;
  key = (void *)((long)key + 4);
  uVar9 = (uVar9 >> 0x29 | uVar9 << 0x17) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
  goto switchD_00109600_caseD_3;
switchD_00109600_caseD_6:
  uVar9 = (ulong)*key * -0x61c8864e7a143579 ^ uVar9;
  uVar9 = (ulong)(byte)*(uint *)((long)key + 4) * 0x27d4eb2f165667c5 ^
          (uVar9 >> 0x29 | uVar9 << 0x17) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
  uVar9 = (uVar9 >> 0x35 | uVar9 << 0xb) * -0x61c8864e7a143579;
  uVar4 = (ulong)*(byte *)((long)key + 5);
  goto LAB_00109aab;
switchD_00109600_caseD_5:
  uVar9 = (ulong)*key * -0x61c8864e7a143579 ^ uVar9;
  uVar9 = (uVar9 >> 0x29 | uVar9 << 0x17) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
  uVar4 = (ulong)(byte)*(uint *)((long)key + 4);
  goto LAB_00109aab;
switchD_00109600_caseD_4:
  uVar9 = (ulong)*key * -0x61c8864e7a143579 ^ uVar9;
  uVar9 = (uVar9 >> 0x29 | uVar9 << 0x17) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
  goto switchD_00109600_caseD_0;
switchD_00109600_caseD_8:
  uVar9 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
          -0x61c8864e7a143579 ^ uVar9;
  uVar9 = (uVar9 >> 0x25 | uVar9 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
switchD_00109600_caseD_0:
  uVar9 = (uVar9 >> 0x21 ^ uVar9) * -0x3d4d51c2d82b14b1;
  uVar9 = (uVar9 >> 0x1d ^ uVar9) * 0x165667b19e3779f9;
  *(ulong *)out = uVar9 >> 0x20 ^ uVar9;
  return;
}

Assistant:

inline void xxHash64_test( const void * key, int len, uint32_t seed, void * out ) {
  // objsize 630-7fc + c10-1213: 1999
  *(uint64_t*)out = (uint64_t) XXH64(key, (size_t) len, (unsigned long long) seed);
}